

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

bool FileExpand::unexpand
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  uchar *puVar5;
  size_type sVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  uint8_t *segmentData;
  SegmentHeader *segmentHdr;
  uint i;
  bool status;
  zlib_params params;
  uint32_t segmentCount;
  SuperHeader *superHdr;
  size_t in_stack_00000118;
  uint8_t *in_stack_00000120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000128;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar8;
  byte bVar9;
  int in_stack_ffffffffffffffc4;
  bool local_1;
  
  bVar4 = checkIfExpanded((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar4) {
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11afc0);
    iVar1 = *(int *)(puVar5 + 8);
    iVar2 = *(int *)(puVar5 + 0xc);
    uVar3 = *(uint *)(puVar5 + 0xc);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11aff0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    boost::iostreams::zlib_params::zlib_params
              ((zlib_params *)&stack0xffffffffffffffc4,-1,8,0xf,8,0,false,false);
    uVar8 = 0x1000000;
    for (uVar7 = 0; bVar9 = (byte)((uint)uVar8 >> 0x18), uVar7 < ((iVar1 + iVar2) - 1U) / uVar3;
        uVar7 = uVar7 + 1) {
      bVar4 = inflate(in_stack_00000128,in_stack_00000120,in_stack_00000118);
      if (!bVar4) {
        bVar9 = 0;
        break;
      }
    }
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
    if (sVar6 != *(uint *)(puVar5 + 4)) {
      bVar9 = 0;
    }
    local_1 = (bool)(bVar9 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FileExpand::unexpand(const std::vector<uint8_t>& in, std::vector<uint8_t>& out)
{
	if (!checkIfExpanded(in)) {
		return false;
	}
	
	const auto superHdr = reinterpret_cast<const SuperHeader*>(in.data());
	const auto segmentCount = (superHdr->fileSize + superHdr->segmentSize - 1) / superHdr->segmentSize;

	out.clear();
	out.reserve(superHdr->decompressedFileSize);
	
	boost::iostreams::zlib_params params;
	params.window_bits = -boost::iostreams::zlib::default_window_bits;
	
	auto status = true;
	for (auto i = 0u; i < segmentCount; ++i) {
		const auto segmentHdr = (i == 0)
			? reinterpret_cast<const SegmentHeader*>(superHdr + 1)
			: reinterpret_cast<const SegmentHeader*>(reinterpret_cast<const uint8_t*>(superHdr) + static_cast<size_t>(superHdr->segmentSize) * i)
		;

		const auto segmentData = reinterpret_cast<const uint8_t*>(segmentHdr + 1);
		if (!inflate(out, segmentData, segmentHdr->zSize)) {
			status = false;
			break;
		}
	}
	
	if (out.size() != superHdr->decompressedFileSize) {
		status = false;
	}
	
	return status;
}